

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundles.c
# Opt level: O0

CURLcode Curl_bundle_create(SessionHandle *data,connectbundle **cb_ptr)

{
  connectbundle *pcVar1;
  curl_llist *pcVar2;
  connectbundle **cb_ptr_local;
  SessionHandle *data_local;
  
  pcVar1 = (connectbundle *)(*Curl_cmalloc)(0x18);
  *cb_ptr = pcVar1;
  if (*cb_ptr == (connectbundle *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    (*cb_ptr)->num_connections = 0;
    (*cb_ptr)->server_supports_pipelining = false;
    pcVar2 = Curl_llist_alloc(conn_llist_dtor);
    (*cb_ptr)->conn_list = pcVar2;
    if ((*cb_ptr)->conn_list == (curl_llist *)0x0) {
      if (*cb_ptr != (connectbundle *)0x0) {
        (*Curl_cfree)(*cb_ptr);
        *cb_ptr = (connectbundle *)0x0;
      }
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_bundle_create(struct SessionHandle *data,
                            struct connectbundle **cb_ptr)
{
  (void)data;
  DEBUGASSERT(*cb_ptr == NULL);
  *cb_ptr = malloc(sizeof(struct connectbundle));
  if(!*cb_ptr)
    return CURLE_OUT_OF_MEMORY;

  (*cb_ptr)->num_connections = 0;
  (*cb_ptr)->server_supports_pipelining = FALSE;

  (*cb_ptr)->conn_list = Curl_llist_alloc((curl_llist_dtor) conn_llist_dtor);
  if(!(*cb_ptr)->conn_list) {
    Curl_safefree(*cb_ptr);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}